

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void load_GL_OES_fixed_point(GLADloadproc load)

{
  if (GLAD_GL_OES_fixed_point != 0) {
    glad_glAlphaFuncxOES = (PFNGLALPHAFUNCXOESPROC)(*load)("glAlphaFuncxOES");
    glad_glClearColorxOES = (PFNGLCLEARCOLORXOESPROC)(*load)("glClearColorxOES");
    glad_glClearDepthxOES = (PFNGLCLEARDEPTHXOESPROC)(*load)("glClearDepthxOES");
    glad_glClipPlanexOES = (PFNGLCLIPPLANEXOESPROC)(*load)("glClipPlanexOES");
    glad_glColor4xOES = (PFNGLCOLOR4XOESPROC)(*load)("glColor4xOES");
    glad_glDepthRangexOES = (PFNGLDEPTHRANGEXOESPROC)(*load)("glDepthRangexOES");
    glad_glFogxOES = (PFNGLFOGXOESPROC)(*load)("glFogxOES");
    glad_glFogxvOES = (PFNGLFOGXVOESPROC)(*load)("glFogxvOES");
    glad_glFrustumxOES = (PFNGLFRUSTUMXOESPROC)(*load)("glFrustumxOES");
    glad_glGetClipPlanexOES = (PFNGLGETCLIPPLANEXOESPROC)(*load)("glGetClipPlanexOES");
    glad_glGetFixedvOES = (PFNGLGETFIXEDVOESPROC)(*load)("glGetFixedvOES");
    glad_glGetTexEnvxvOES = (PFNGLGETTEXENVXVOESPROC)(*load)("glGetTexEnvxvOES");
    glad_glGetTexParameterxvOES = (PFNGLGETTEXPARAMETERXVOESPROC)(*load)("glGetTexParameterxvOES");
    glad_glLightModelxOES = (PFNGLLIGHTMODELXOESPROC)(*load)("glLightModelxOES");
    glad_glLightModelxvOES = (PFNGLLIGHTMODELXVOESPROC)(*load)("glLightModelxvOES");
    glad_glLightxOES = (PFNGLLIGHTXOESPROC)(*load)("glLightxOES");
    glad_glLightxvOES = (PFNGLLIGHTXVOESPROC)(*load)("glLightxvOES");
    glad_glLineWidthxOES = (PFNGLLINEWIDTHXOESPROC)(*load)("glLineWidthxOES");
    glad_glLoadMatrixxOES = (PFNGLLOADMATRIXXOESPROC)(*load)("glLoadMatrixxOES");
    glad_glMaterialxOES = (PFNGLMATERIALXOESPROC)(*load)("glMaterialxOES");
    glad_glMaterialxvOES = (PFNGLMATERIALXVOESPROC)(*load)("glMaterialxvOES");
    glad_glMultMatrixxOES = (PFNGLMULTMATRIXXOESPROC)(*load)("glMultMatrixxOES");
    glad_glMultiTexCoord4xOES = (PFNGLMULTITEXCOORD4XOESPROC)(*load)("glMultiTexCoord4xOES");
    glad_glNormal3xOES = (PFNGLNORMAL3XOESPROC)(*load)("glNormal3xOES");
    glad_glOrthoxOES = (PFNGLORTHOXOESPROC)(*load)("glOrthoxOES");
    glad_glPointParameterxvOES = (PFNGLPOINTPARAMETERXVOESPROC)(*load)("glPointParameterxvOES");
    glad_glPointSizexOES = (PFNGLPOINTSIZEXOESPROC)(*load)("glPointSizexOES");
    glad_glPolygonOffsetxOES = (PFNGLPOLYGONOFFSETXOESPROC)(*load)("glPolygonOffsetxOES");
    glad_glRotatexOES = (PFNGLROTATEXOESPROC)(*load)("glRotatexOES");
    glad_glScalexOES = (PFNGLSCALEXOESPROC)(*load)("glScalexOES");
    glad_glTexEnvxOES = (PFNGLTEXENVXOESPROC)(*load)("glTexEnvxOES");
    glad_glTexEnvxvOES = (PFNGLTEXENVXVOESPROC)(*load)("glTexEnvxvOES");
    glad_glTexParameterxOES = (PFNGLTEXPARAMETERXOESPROC)(*load)("glTexParameterxOES");
    glad_glTexParameterxvOES = (PFNGLTEXPARAMETERXVOESPROC)(*load)("glTexParameterxvOES");
    glad_glTranslatexOES = (PFNGLTRANSLATEXOESPROC)(*load)("glTranslatexOES");
    glad_glGetLightxvOES = (PFNGLGETLIGHTXVOESPROC)(*load)("glGetLightxvOES");
    glad_glGetMaterialxvOES = (PFNGLGETMATERIALXVOESPROC)(*load)("glGetMaterialxvOES");
    glad_glPointParameterxOES = (PFNGLPOINTPARAMETERXOESPROC)(*load)("glPointParameterxOES");
    glad_glSampleCoveragexOES = (PFNGLSAMPLECOVERAGEXOESPROC)(*load)("glSampleCoveragexOES");
    glad_glAccumxOES = (PFNGLACCUMXOESPROC)(*load)("glAccumxOES");
    glad_glBitmapxOES = (PFNGLBITMAPXOESPROC)(*load)("glBitmapxOES");
    glad_glBlendColorxOES = (PFNGLBLENDCOLORXOESPROC)(*load)("glBlendColorxOES");
    glad_glClearAccumxOES = (PFNGLCLEARACCUMXOESPROC)(*load)("glClearAccumxOES");
    glad_glColor3xOES = (PFNGLCOLOR3XOESPROC)(*load)("glColor3xOES");
    glad_glColor3xvOES = (PFNGLCOLOR3XVOESPROC)(*load)("glColor3xvOES");
    glad_glColor4xvOES = (PFNGLCOLOR4XVOESPROC)(*load)("glColor4xvOES");
    glad_glConvolutionParameterxOES =
         (PFNGLCONVOLUTIONPARAMETERXOESPROC)(*load)("glConvolutionParameterxOES");
    glad_glConvolutionParameterxvOES =
         (PFNGLCONVOLUTIONPARAMETERXVOESPROC)(*load)("glConvolutionParameterxvOES");
    glad_glEvalCoord1xOES = (PFNGLEVALCOORD1XOESPROC)(*load)("glEvalCoord1xOES");
    glad_glEvalCoord1xvOES = (PFNGLEVALCOORD1XVOESPROC)(*load)("glEvalCoord1xvOES");
    glad_glEvalCoord2xOES = (PFNGLEVALCOORD2XOESPROC)(*load)("glEvalCoord2xOES");
    glad_glEvalCoord2xvOES = (PFNGLEVALCOORD2XVOESPROC)(*load)("glEvalCoord2xvOES");
    glad_glFeedbackBufferxOES = (PFNGLFEEDBACKBUFFERXOESPROC)(*load)("glFeedbackBufferxOES");
    glad_glGetConvolutionParameterxvOES =
         (PFNGLGETCONVOLUTIONPARAMETERXVOESPROC)(*load)("glGetConvolutionParameterxvOES");
    glad_glGetHistogramParameterxvOES =
         (PFNGLGETHISTOGRAMPARAMETERXVOESPROC)(*load)("glGetHistogramParameterxvOES");
    glad_glGetLightxOES = (PFNGLGETLIGHTXOESPROC)(*load)("glGetLightxOES");
    glad_glGetMapxvOES = (PFNGLGETMAPXVOESPROC)(*load)("glGetMapxvOES");
    glad_glGetMaterialxOES = (PFNGLGETMATERIALXOESPROC)(*load)("glGetMaterialxOES");
    glad_glGetPixelMapxv = (PFNGLGETPIXELMAPXVPROC)(*load)("glGetPixelMapxv");
    glad_glGetTexGenxvOES = (PFNGLGETTEXGENXVOESPROC)(*load)("glGetTexGenxvOES");
    glad_glGetTexLevelParameterxvOES =
         (PFNGLGETTEXLEVELPARAMETERXVOESPROC)(*load)("glGetTexLevelParameterxvOES");
    glad_glIndexxOES = (PFNGLINDEXXOESPROC)(*load)("glIndexxOES");
    glad_glIndexxvOES = (PFNGLINDEXXVOESPROC)(*load)("glIndexxvOES");
    glad_glLoadTransposeMatrixxOES =
         (PFNGLLOADTRANSPOSEMATRIXXOESPROC)(*load)("glLoadTransposeMatrixxOES");
    glad_glMap1xOES = (PFNGLMAP1XOESPROC)(*load)("glMap1xOES");
    glad_glMap2xOES = (PFNGLMAP2XOESPROC)(*load)("glMap2xOES");
    glad_glMapGrid1xOES = (PFNGLMAPGRID1XOESPROC)(*load)("glMapGrid1xOES");
    glad_glMapGrid2xOES = (PFNGLMAPGRID2XOESPROC)(*load)("glMapGrid2xOES");
    glad_glMultTransposeMatrixxOES =
         (PFNGLMULTTRANSPOSEMATRIXXOESPROC)(*load)("glMultTransposeMatrixxOES");
    glad_glMultiTexCoord1xOES = (PFNGLMULTITEXCOORD1XOESPROC)(*load)("glMultiTexCoord1xOES");
    glad_glMultiTexCoord1xvOES = (PFNGLMULTITEXCOORD1XVOESPROC)(*load)("glMultiTexCoord1xvOES");
    glad_glMultiTexCoord2xOES = (PFNGLMULTITEXCOORD2XOESPROC)(*load)("glMultiTexCoord2xOES");
    glad_glMultiTexCoord2xvOES = (PFNGLMULTITEXCOORD2XVOESPROC)(*load)("glMultiTexCoord2xvOES");
    glad_glMultiTexCoord3xOES = (PFNGLMULTITEXCOORD3XOESPROC)(*load)("glMultiTexCoord3xOES");
    glad_glMultiTexCoord3xvOES = (PFNGLMULTITEXCOORD3XVOESPROC)(*load)("glMultiTexCoord3xvOES");
    glad_glMultiTexCoord4xvOES = (PFNGLMULTITEXCOORD4XVOESPROC)(*load)("glMultiTexCoord4xvOES");
    glad_glNormal3xvOES = (PFNGLNORMAL3XVOESPROC)(*load)("glNormal3xvOES");
    glad_glPassThroughxOES = (PFNGLPASSTHROUGHXOESPROC)(*load)("glPassThroughxOES");
    glad_glPixelMapx = (PFNGLPIXELMAPXPROC)(*load)("glPixelMapx");
    glad_glPixelStorex = (PFNGLPIXELSTOREXPROC)(*load)("glPixelStorex");
    glad_glPixelTransferxOES = (PFNGLPIXELTRANSFERXOESPROC)(*load)("glPixelTransferxOES");
    glad_glPixelZoomxOES = (PFNGLPIXELZOOMXOESPROC)(*load)("glPixelZoomxOES");
    glad_glPrioritizeTexturesxOES =
         (PFNGLPRIORITIZETEXTURESXOESPROC)(*load)("glPrioritizeTexturesxOES");
    glad_glRasterPos2xOES = (PFNGLRASTERPOS2XOESPROC)(*load)("glRasterPos2xOES");
    glad_glRasterPos2xvOES = (PFNGLRASTERPOS2XVOESPROC)(*load)("glRasterPos2xvOES");
    glad_glRasterPos3xOES = (PFNGLRASTERPOS3XOESPROC)(*load)("glRasterPos3xOES");
    glad_glRasterPos3xvOES = (PFNGLRASTERPOS3XVOESPROC)(*load)("glRasterPos3xvOES");
    glad_glRasterPos4xOES = (PFNGLRASTERPOS4XOESPROC)(*load)("glRasterPos4xOES");
    glad_glRasterPos4xvOES = (PFNGLRASTERPOS4XVOESPROC)(*load)("glRasterPos4xvOES");
    glad_glRectxOES = (PFNGLRECTXOESPROC)(*load)("glRectxOES");
    glad_glRectxvOES = (PFNGLRECTXVOESPROC)(*load)("glRectxvOES");
    glad_glTexCoord1xOES = (PFNGLTEXCOORD1XOESPROC)(*load)("glTexCoord1xOES");
    glad_glTexCoord1xvOES = (PFNGLTEXCOORD1XVOESPROC)(*load)("glTexCoord1xvOES");
    glad_glTexCoord2xOES = (PFNGLTEXCOORD2XOESPROC)(*load)("glTexCoord2xOES");
    glad_glTexCoord2xvOES = (PFNGLTEXCOORD2XVOESPROC)(*load)("glTexCoord2xvOES");
    glad_glTexCoord3xOES = (PFNGLTEXCOORD3XOESPROC)(*load)("glTexCoord3xOES");
    glad_glTexCoord3xvOES = (PFNGLTEXCOORD3XVOESPROC)(*load)("glTexCoord3xvOES");
    glad_glTexCoord4xOES = (PFNGLTEXCOORD4XOESPROC)(*load)("glTexCoord4xOES");
    glad_glTexCoord4xvOES = (PFNGLTEXCOORD4XVOESPROC)(*load)("glTexCoord4xvOES");
    glad_glTexGenxOES = (PFNGLTEXGENXOESPROC)(*load)("glTexGenxOES");
    glad_glTexGenxvOES = (PFNGLTEXGENXVOESPROC)(*load)("glTexGenxvOES");
    glad_glVertex2xOES = (PFNGLVERTEX2XOESPROC)(*load)("glVertex2xOES");
    glad_glVertex2xvOES = (PFNGLVERTEX2XVOESPROC)(*load)("glVertex2xvOES");
    glad_glVertex3xOES = (PFNGLVERTEX3XOESPROC)(*load)("glVertex3xOES");
    glad_glVertex3xvOES = (PFNGLVERTEX3XVOESPROC)(*load)("glVertex3xvOES");
    glad_glVertex4xOES = (PFNGLVERTEX4XOESPROC)(*load)("glVertex4xOES");
    glad_glVertex4xvOES = (PFNGLVERTEX4XVOESPROC)(*load)("glVertex4xvOES");
  }
  return;
}

Assistant:

static void load_GL_OES_fixed_point(GLADloadproc load) {
	if(!GLAD_GL_OES_fixed_point) return;
	glad_glAlphaFuncxOES = (PFNGLALPHAFUNCXOESPROC)load("glAlphaFuncxOES");
	glad_glClearColorxOES = (PFNGLCLEARCOLORXOESPROC)load("glClearColorxOES");
	glad_glClearDepthxOES = (PFNGLCLEARDEPTHXOESPROC)load("glClearDepthxOES");
	glad_glClipPlanexOES = (PFNGLCLIPPLANEXOESPROC)load("glClipPlanexOES");
	glad_glColor4xOES = (PFNGLCOLOR4XOESPROC)load("glColor4xOES");
	glad_glDepthRangexOES = (PFNGLDEPTHRANGEXOESPROC)load("glDepthRangexOES");
	glad_glFogxOES = (PFNGLFOGXOESPROC)load("glFogxOES");
	glad_glFogxvOES = (PFNGLFOGXVOESPROC)load("glFogxvOES");
	glad_glFrustumxOES = (PFNGLFRUSTUMXOESPROC)load("glFrustumxOES");
	glad_glGetClipPlanexOES = (PFNGLGETCLIPPLANEXOESPROC)load("glGetClipPlanexOES");
	glad_glGetFixedvOES = (PFNGLGETFIXEDVOESPROC)load("glGetFixedvOES");
	glad_glGetTexEnvxvOES = (PFNGLGETTEXENVXVOESPROC)load("glGetTexEnvxvOES");
	glad_glGetTexParameterxvOES = (PFNGLGETTEXPARAMETERXVOESPROC)load("glGetTexParameterxvOES");
	glad_glLightModelxOES = (PFNGLLIGHTMODELXOESPROC)load("glLightModelxOES");
	glad_glLightModelxvOES = (PFNGLLIGHTMODELXVOESPROC)load("glLightModelxvOES");
	glad_glLightxOES = (PFNGLLIGHTXOESPROC)load("glLightxOES");
	glad_glLightxvOES = (PFNGLLIGHTXVOESPROC)load("glLightxvOES");
	glad_glLineWidthxOES = (PFNGLLINEWIDTHXOESPROC)load("glLineWidthxOES");
	glad_glLoadMatrixxOES = (PFNGLLOADMATRIXXOESPROC)load("glLoadMatrixxOES");
	glad_glMaterialxOES = (PFNGLMATERIALXOESPROC)load("glMaterialxOES");
	glad_glMaterialxvOES = (PFNGLMATERIALXVOESPROC)load("glMaterialxvOES");
	glad_glMultMatrixxOES = (PFNGLMULTMATRIXXOESPROC)load("glMultMatrixxOES");
	glad_glMultiTexCoord4xOES = (PFNGLMULTITEXCOORD4XOESPROC)load("glMultiTexCoord4xOES");
	glad_glNormal3xOES = (PFNGLNORMAL3XOESPROC)load("glNormal3xOES");
	glad_glOrthoxOES = (PFNGLORTHOXOESPROC)load("glOrthoxOES");
	glad_glPointParameterxvOES = (PFNGLPOINTPARAMETERXVOESPROC)load("glPointParameterxvOES");
	glad_glPointSizexOES = (PFNGLPOINTSIZEXOESPROC)load("glPointSizexOES");
	glad_glPolygonOffsetxOES = (PFNGLPOLYGONOFFSETXOESPROC)load("glPolygonOffsetxOES");
	glad_glRotatexOES = (PFNGLROTATEXOESPROC)load("glRotatexOES");
	glad_glScalexOES = (PFNGLSCALEXOESPROC)load("glScalexOES");
	glad_glTexEnvxOES = (PFNGLTEXENVXOESPROC)load("glTexEnvxOES");
	glad_glTexEnvxvOES = (PFNGLTEXENVXVOESPROC)load("glTexEnvxvOES");
	glad_glTexParameterxOES = (PFNGLTEXPARAMETERXOESPROC)load("glTexParameterxOES");
	glad_glTexParameterxvOES = (PFNGLTEXPARAMETERXVOESPROC)load("glTexParameterxvOES");
	glad_glTranslatexOES = (PFNGLTRANSLATEXOESPROC)load("glTranslatexOES");
	glad_glGetLightxvOES = (PFNGLGETLIGHTXVOESPROC)load("glGetLightxvOES");
	glad_glGetMaterialxvOES = (PFNGLGETMATERIALXVOESPROC)load("glGetMaterialxvOES");
	glad_glPointParameterxOES = (PFNGLPOINTPARAMETERXOESPROC)load("glPointParameterxOES");
	glad_glSampleCoveragexOES = (PFNGLSAMPLECOVERAGEXOESPROC)load("glSampleCoveragexOES");
	glad_glAccumxOES = (PFNGLACCUMXOESPROC)load("glAccumxOES");
	glad_glBitmapxOES = (PFNGLBITMAPXOESPROC)load("glBitmapxOES");
	glad_glBlendColorxOES = (PFNGLBLENDCOLORXOESPROC)load("glBlendColorxOES");
	glad_glClearAccumxOES = (PFNGLCLEARACCUMXOESPROC)load("glClearAccumxOES");
	glad_glColor3xOES = (PFNGLCOLOR3XOESPROC)load("glColor3xOES");
	glad_glColor3xvOES = (PFNGLCOLOR3XVOESPROC)load("glColor3xvOES");
	glad_glColor4xvOES = (PFNGLCOLOR4XVOESPROC)load("glColor4xvOES");
	glad_glConvolutionParameterxOES = (PFNGLCONVOLUTIONPARAMETERXOESPROC)load("glConvolutionParameterxOES");
	glad_glConvolutionParameterxvOES = (PFNGLCONVOLUTIONPARAMETERXVOESPROC)load("glConvolutionParameterxvOES");
	glad_glEvalCoord1xOES = (PFNGLEVALCOORD1XOESPROC)load("glEvalCoord1xOES");
	glad_glEvalCoord1xvOES = (PFNGLEVALCOORD1XVOESPROC)load("glEvalCoord1xvOES");
	glad_glEvalCoord2xOES = (PFNGLEVALCOORD2XOESPROC)load("glEvalCoord2xOES");
	glad_glEvalCoord2xvOES = (PFNGLEVALCOORD2XVOESPROC)load("glEvalCoord2xvOES");
	glad_glFeedbackBufferxOES = (PFNGLFEEDBACKBUFFERXOESPROC)load("glFeedbackBufferxOES");
	glad_glGetConvolutionParameterxvOES = (PFNGLGETCONVOLUTIONPARAMETERXVOESPROC)load("glGetConvolutionParameterxvOES");
	glad_glGetHistogramParameterxvOES = (PFNGLGETHISTOGRAMPARAMETERXVOESPROC)load("glGetHistogramParameterxvOES");
	glad_glGetLightxOES = (PFNGLGETLIGHTXOESPROC)load("glGetLightxOES");
	glad_glGetMapxvOES = (PFNGLGETMAPXVOESPROC)load("glGetMapxvOES");
	glad_glGetMaterialxOES = (PFNGLGETMATERIALXOESPROC)load("glGetMaterialxOES");
	glad_glGetPixelMapxv = (PFNGLGETPIXELMAPXVPROC)load("glGetPixelMapxv");
	glad_glGetTexGenxvOES = (PFNGLGETTEXGENXVOESPROC)load("glGetTexGenxvOES");
	glad_glGetTexLevelParameterxvOES = (PFNGLGETTEXLEVELPARAMETERXVOESPROC)load("glGetTexLevelParameterxvOES");
	glad_glIndexxOES = (PFNGLINDEXXOESPROC)load("glIndexxOES");
	glad_glIndexxvOES = (PFNGLINDEXXVOESPROC)load("glIndexxvOES");
	glad_glLoadTransposeMatrixxOES = (PFNGLLOADTRANSPOSEMATRIXXOESPROC)load("glLoadTransposeMatrixxOES");
	glad_glMap1xOES = (PFNGLMAP1XOESPROC)load("glMap1xOES");
	glad_glMap2xOES = (PFNGLMAP2XOESPROC)load("glMap2xOES");
	glad_glMapGrid1xOES = (PFNGLMAPGRID1XOESPROC)load("glMapGrid1xOES");
	glad_glMapGrid2xOES = (PFNGLMAPGRID2XOESPROC)load("glMapGrid2xOES");
	glad_glMultTransposeMatrixxOES = (PFNGLMULTTRANSPOSEMATRIXXOESPROC)load("glMultTransposeMatrixxOES");
	glad_glMultiTexCoord1xOES = (PFNGLMULTITEXCOORD1XOESPROC)load("glMultiTexCoord1xOES");
	glad_glMultiTexCoord1xvOES = (PFNGLMULTITEXCOORD1XVOESPROC)load("glMultiTexCoord1xvOES");
	glad_glMultiTexCoord2xOES = (PFNGLMULTITEXCOORD2XOESPROC)load("glMultiTexCoord2xOES");
	glad_glMultiTexCoord2xvOES = (PFNGLMULTITEXCOORD2XVOESPROC)load("glMultiTexCoord2xvOES");
	glad_glMultiTexCoord3xOES = (PFNGLMULTITEXCOORD3XOESPROC)load("glMultiTexCoord3xOES");
	glad_glMultiTexCoord3xvOES = (PFNGLMULTITEXCOORD3XVOESPROC)load("glMultiTexCoord3xvOES");
	glad_glMultiTexCoord4xvOES = (PFNGLMULTITEXCOORD4XVOESPROC)load("glMultiTexCoord4xvOES");
	glad_glNormal3xvOES = (PFNGLNORMAL3XVOESPROC)load("glNormal3xvOES");
	glad_glPassThroughxOES = (PFNGLPASSTHROUGHXOESPROC)load("glPassThroughxOES");
	glad_glPixelMapx = (PFNGLPIXELMAPXPROC)load("glPixelMapx");
	glad_glPixelStorex = (PFNGLPIXELSTOREXPROC)load("glPixelStorex");
	glad_glPixelTransferxOES = (PFNGLPIXELTRANSFERXOESPROC)load("glPixelTransferxOES");
	glad_glPixelZoomxOES = (PFNGLPIXELZOOMXOESPROC)load("glPixelZoomxOES");
	glad_glPrioritizeTexturesxOES = (PFNGLPRIORITIZETEXTURESXOESPROC)load("glPrioritizeTexturesxOES");
	glad_glRasterPos2xOES = (PFNGLRASTERPOS2XOESPROC)load("glRasterPos2xOES");
	glad_glRasterPos2xvOES = (PFNGLRASTERPOS2XVOESPROC)load("glRasterPos2xvOES");
	glad_glRasterPos3xOES = (PFNGLRASTERPOS3XOESPROC)load("glRasterPos3xOES");
	glad_glRasterPos3xvOES = (PFNGLRASTERPOS3XVOESPROC)load("glRasterPos3xvOES");
	glad_glRasterPos4xOES = (PFNGLRASTERPOS4XOESPROC)load("glRasterPos4xOES");
	glad_glRasterPos4xvOES = (PFNGLRASTERPOS4XVOESPROC)load("glRasterPos4xvOES");
	glad_glRectxOES = (PFNGLRECTXOESPROC)load("glRectxOES");
	glad_glRectxvOES = (PFNGLRECTXVOESPROC)load("glRectxvOES");
	glad_glTexCoord1xOES = (PFNGLTEXCOORD1XOESPROC)load("glTexCoord1xOES");
	glad_glTexCoord1xvOES = (PFNGLTEXCOORD1XVOESPROC)load("glTexCoord1xvOES");
	glad_glTexCoord2xOES = (PFNGLTEXCOORD2XOESPROC)load("glTexCoord2xOES");
	glad_glTexCoord2xvOES = (PFNGLTEXCOORD2XVOESPROC)load("glTexCoord2xvOES");
	glad_glTexCoord3xOES = (PFNGLTEXCOORD3XOESPROC)load("glTexCoord3xOES");
	glad_glTexCoord3xvOES = (PFNGLTEXCOORD3XVOESPROC)load("glTexCoord3xvOES");
	glad_glTexCoord4xOES = (PFNGLTEXCOORD4XOESPROC)load("glTexCoord4xOES");
	glad_glTexCoord4xvOES = (PFNGLTEXCOORD4XVOESPROC)load("glTexCoord4xvOES");
	glad_glTexGenxOES = (PFNGLTEXGENXOESPROC)load("glTexGenxOES");
	glad_glTexGenxvOES = (PFNGLTEXGENXVOESPROC)load("glTexGenxvOES");
	glad_glVertex2xOES = (PFNGLVERTEX2XOESPROC)load("glVertex2xOES");
	glad_glVertex2xvOES = (PFNGLVERTEX2XVOESPROC)load("glVertex2xvOES");
	glad_glVertex3xOES = (PFNGLVERTEX3XOESPROC)load("glVertex3xOES");
	glad_glVertex3xvOES = (PFNGLVERTEX3XVOESPROC)load("glVertex3xvOES");
	glad_glVertex4xOES = (PFNGLVERTEX4XOESPROC)load("glVertex4xOES");
	glad_glVertex4xvOES = (PFNGLVERTEX4XVOESPROC)load("glVertex4xvOES");
}